

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O1

void zerohyp_multi(int N,double *b,int p,double *varcovar,double *tval,double *pval)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  
  if (0 < p) {
    uVar1 = 0;
    do {
      dVar3 = b[uVar1];
      dVar2 = *varcovar;
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      tval[uVar1] = ABS(dVar3) / dVar2;
      dVar3 = tcdf(ABS(ABS(dVar3) / dVar2),N - p);
      pval[uVar1] = 1.0 - dVar3;
      uVar1 = uVar1 + 1;
      varcovar = varcovar + (ulong)(uint)p + 1;
    } while ((uint)p != uVar1);
  }
  return;
}

Assistant:

void zerohyp_multi(int N, double *b, int p, double *varcovar, double *tval, double *pval) {
	int df, i;
	/*
	* Zero Hypothesis Test for CLRM
	*/

	df = N - p;

	for (i = 0; i < p; ++i) {
		tval[i] = fabs(b[i]) / sqrt(varcovar[(p + 1)*i]);
		pval[i] = 1.0 - tcdf(fabs(tval[i]), df);
	}

}